

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BrepFace * __thiscall ON_Brep::NewFace(ON_Brep *this,int si)

{
  int iVar1;
  ON_BrepFace *pOVar2;
  ON_Surface **ppOVar3;
  ON_BrepFace *face;
  int fi;
  int si_local;
  ON_Brep *this_local;
  
  ON_BoundingBox::Destroy(&this->m_bbox);
  this->m_is_solid = 0;
  iVar1 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
  ON_ClassArray<ON_BrepFace>::Reserve((ON_ClassArray<ON_BrepFace> *)&this->m_F,(long)(iVar1 + 1));
  ON_ClassArray<ON_BrepFace>::SetCount((ON_ClassArray<ON_BrepFace> *)&this->m_F,iVar1 + 1);
  pOVar2 = ON_ClassArray<ON_BrepFace>::Array((ON_ClassArray<ON_BrepFace> *)&this->m_F);
  pOVar2 = pOVar2 + iVar1;
  pOVar2->m_face_index = iVar1;
  pOVar2->m_si = si;
  pOVar2->m_brep = this;
  if (-1 < si) {
    iVar1 = ON_SimpleArray<ON_Surface_*>::Count(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
    if (si < iVar1) {
      ppOVar3 = ON_SimpleArray<ON_Surface_*>::operator[]
                          (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,si);
      ON_SurfaceProxy::SetProxySurface(&pOVar2->super_ON_SurfaceProxy,*ppOVar3);
    }
  }
  return pOVar2;
}

Assistant:

ON_BrepFace& ON_Brep::NewFace( int si )
{
  m_bbox.Destroy();
  // GBA 28-MAy-2020 RH-58462.  m_bbox is now left unset after this function
  // This works since ON_BrepFace::BoundingBox() supports lazy evaluation 
  m_is_solid = 0;
  int fi = m_F.Count();
  m_F.Reserve(fi+1);
  m_F.SetCount(fi+1);
  ON_BrepFace& face = m_F.Array()[fi];
  face.m_face_index = fi;
  face.m_si = si;
  face.m_brep = this;
  if ( si >= 0 && si < m_S.Count() )
    face.SetProxySurface(m_S[si]);
  
  return face;
}